

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_attr<tinyusdz::value::color4f>
                   (string *__return_storage_ptr__,
                   TypedAttributeWithFallback<tinyusdz::value::color4f> *attr,string *name,
                   uint32_t indent)

{
  Path *v;
  bool bVar1;
  ostream *poVar2;
  color4f *v_00;
  pointer pPVar3;
  long lVar4;
  uint32_t uVar5;
  pointer pPVar6;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  stringstream ss;
  string sStack_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  pPVar6 = (pointer)(ulong)indent;
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar1 = TypedAttributeWithFallback<tinyusdz::value::color4f>::authored(attr);
  if (!bVar1) goto LAB_001e194d;
  bVar1 = AttrMetas::authored(&attr->_metas);
  if ((bVar1) || (attr->_blocked != false)) {
LAB_001e16fa:
    uVar5 = (uint32_t)pPVar6;
    pprint::Indent_abi_cxx11_(&sStack_1f8,(pprint *)(ulong)indent,n);
    std::operator<<(local_1a8,(string *)&sStack_1f8);
    std::__cxx11::string::_M_dispose();
    std::operator<<(local_1a8,"uniform ");
    value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
    poVar2 = std::operator<<(local_1a8,(string *)&sStack_1f8);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,(string *)name);
    std::__cxx11::string::_M_dispose();
    if (attr->_blocked == true) {
      std::operator<<(local_1a8," = None");
    }
    else {
      poVar2 = std::operator<<(local_1a8," = ");
      v_00 = TypedAttributeWithFallback<tinyusdz::value::color4f>::get_value(attr);
      std::operator<<(poVar2,v_00);
    }
    bVar1 = AttrMetas::authored(&attr->_metas);
    if (bVar1) {
      poVar2 = std::operator<<(local_1a8," (\n");
      print_attr_metas_abi_cxx11_
                (&sStack_1f8,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),uVar5);
      poVar2 = std::operator<<(poVar2,(string *)&sStack_1f8);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
      poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
      std::operator<<(poVar2,")");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    std::operator<<(local_1a8,"\n");
    pPVar3 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar6 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar5 = extraout_EDX;
  }
  else {
    pPVar3 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar6 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((pPVar6 == pPVar3) || (uVar5 = n, (attr->_empty & 1U) == 0)) goto LAB_001e16fa;
  }
  if (pPVar6 != pPVar3) {
    pprint::Indent_abi_cxx11_(&sStack_1f8,(pprint *)(ulong)indent,uVar5);
    std::operator<<(local_1a8,(string *)&sStack_1f8);
    std::__cxx11::string::_M_dispose();
    std::operator<<(local_1a8,"uniform ");
    value::TypeTraits<tinyusdz::value::color4f>::type_name_abi_cxx11_();
    poVar2 = std::operator<<(local_1a8,(string *)&sStack_1f8);
    poVar2 = std::operator<<(poVar2," ");
    std::operator<<(poVar2,(string *)name);
    std::__cxx11::string::_M_dispose();
    std::operator<<(local_1a8,".connect = ");
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar4 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v) / 0xd0;
    if (lVar4 == 0) {
      std::operator<<(local_1a8,"[InternalError]");
    }
    else if (lVar4 == 1) {
      std::operator<<(local_1a8,v);
    }
    else {
      std::operator<<(local_1a8,&attr->_paths);
    }
  }
LAB_001e194d:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttributeWithFallback<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    // default
    if (attr.metas().authored() || attr.is_blocked() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else {
        ss << " = " << attr.get_value();
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
    }
  }

  return ss.str();
}